

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

size_t helics::detail::convertToBinary(byte *data,int64_t val)

{
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  *data = 0x50;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 1;
  *(int64_t *)(data + 8) = val;
  return 0x10;
}

Assistant:

static inline void addCodeAndSize(std::byte* data, std::byte code, size_t size)
{
    std::memset(data, 0, 8);
    data[0] = code;
    data[3] = littleEndianCode;
    data[4] = static_cast<std::byte>((size >> 24U) & 0xFFU);
    data[5] = static_cast<std::byte>((size >> 16U) & 0xFFU);
    data[6] = static_cast<std::byte>((size >> 8U) & 0xFFU);
    data[7] = static_cast<std::byte>((size & 0xFFU));
}